

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_base.h
# Opt level: O1

Violation mp::
          ComputeViolation<std::array<int,2ul>,std::array<int,0ul>,mp::LogicalFunctionalConstraintTraits,mp::EquivalenceId,mp::VarInfoImpl<std::vector<double,std::allocator<double>>>>
                    (CustomFunctionalConstraint<std::array<int,_2UL>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::EquivalenceId>
                     *c,VarInfoImpl<std::vector<double,_std::allocator<double>_>_> *x)

{
  int iVar1;
  int iVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  Violation VVar6;
  
  iVar1 = *(int *)(c + 0x20);
  dVar4 = (x->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[iVar1];
  if (x->recomp_vals_ == false) {
    dVar3 = ComputeValue<mp::CustomFunctionalConstraint<std::array<int,2ul>,std::array<int,0ul>,mp::LogicalFunctionalConstraintTraits,mp::EquivalenceId>,mp::VarInfoImpl<std::vector<double,std::allocator<double>>>>
                      (c,x);
    dVar3 = dVar4 - dVar3;
    iVar2 = *(int *)(c + 0x24);
    if (iVar2 != 2) {
      if (iVar2 == 3) {
        dVar3 = -dVar3;
      }
      else {
        if (iVar2 != 4) {
          dVar4 = 0.0;
          dVar3 = INFINITY;
          goto LAB_001c0403;
        }
        dVar3 = ABS(dVar3);
      }
    }
    dVar4 = (x->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[iVar1];
  }
  else {
    dVar5 = (x->lb_).data_[iVar1] - dVar4;
    dVar3 = dVar4 - (x->ub_).data_[iVar1];
    if (dVar3 <= dVar5) {
      dVar3 = dVar5;
    }
    if (dVar3 <= 0.0) {
      dVar3 = 0.0;
    }
    dVar3 = dVar3 + ABS(dVar4 - (x->x_raw_).data_[iVar1]);
  }
LAB_001c0403:
  VVar6.valX_ = dVar4;
  VVar6.viol_ = dVar3;
  return VVar6;
}

Assistant:

Violation ComputeViolation(
    const CustomFunctionalConstraint<Args, Params, NumOrLogic, Id>& c,
    const VarVec& x) {
  auto resvar = c.GetResultVar();
  if (!x.recomp_vals()) {    // solver's var values: normal check
    auto viol = x[resvar] - ComputeValue(c, x);
    switch (c.GetContext().GetValue()) {
    case Context::CTX_MIX:
      return {std::fabs(viol), x[resvar]};
    case Context::CTX_POS:
      return {viol, x[resvar]};
    case Context::CTX_NEG:
      return {-viol, x[resvar]};
    default:
      return {INFINITY, 0.0};
    }
  }
  return                              // recomputed var minus solver's
  { std::fabs(x[resvar] - x.raw(resvar))
        + std::max(0.0, x.bounds_viol(resvar)), x[resvar]};
}